

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Identification::Dump(Identification *this,FILE *stream)

{
  undefined8 uVar1;
  char *pcVar2;
  char identbuf [128];
  
  identbuf[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  uVar1 = Kumu::bin2UUIDhex((this->ThisGenerationUID).super_Identifier<16U>.m_Value,0x10,identbuf,
                            0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ThisGenerationUID",uVar1);
  pcVar2 = UTF16String::EncodeString(&this->CompanyName,identbuf,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","CompanyName",pcVar2);
  pcVar2 = UTF16String::EncodeString(&this->ProductName,identbuf,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ProductName",pcVar2);
  snprintf(identbuf,0x80,"%hu.%hu.%hu.%hur%hu",(ulong)(this->ProductVersion).Major,
           (ulong)(this->ProductVersion).Minor,(ulong)(this->ProductVersion).Patch,
           (ulong)(this->ProductVersion).Build,(ulong)(ushort)(short)(this->ProductVersion).Release)
  ;
  fprintf((FILE *)stream,"  %22s = %s\n","ProductVersion",identbuf);
  pcVar2 = UTF16String::EncodeString(&this->VersionString,identbuf,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","VersionString",pcVar2);
  uVar1 = Kumu::bin2UUIDhex((this->ProductUID).super_Identifier<16U>.m_Value,0x10,identbuf,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","ProductUID",uVar1);
  uVar1 = Kumu::Timestamp::EncodeString((char *)&this->ModificationDate,(uint)identbuf);
  fprintf((FILE *)stream,"  %22s = %s\n","ModificationDate",uVar1);
  snprintf(identbuf,0x80,"%hu.%hu.%hu.%hur%hu",(ulong)(this->ToolkitVersion).Major,
           (ulong)(this->ToolkitVersion).Minor,(ulong)(this->ToolkitVersion).Patch,
           (ulong)(this->ToolkitVersion).Build,(ulong)(ushort)(short)(this->ToolkitVersion).Release)
  ;
  fprintf((FILE *)stream,"  %22s = %s\n","ToolkitVersion",identbuf);
  if ((this->Platform).m_has_value == true) {
    pcVar2 = UTF16String::EncodeString(&(this->Platform).m_property,identbuf,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","Platform",pcVar2);
  }
  return;
}

Assistant:

void
Identification::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "ThisGenerationUID", ThisGenerationUID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "CompanyName", CompanyName.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductName", ProductName.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductVersion", ProductVersion.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "VersionString", VersionString.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ProductUID", ProductUID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ModificationDate", ModificationDate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "ToolkitVersion", ToolkitVersion.EncodeString(identbuf, IdentBufferLen));
  if ( ! Platform.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Platform", Platform.get().EncodeString(identbuf, IdentBufferLen));
  }
}